

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O0

ostream * cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>
                    (ostream *strm,char *fortran_cbindings_name,char *fortran_name)

{
  char *pcVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  allocator<char> local_321;
  string local_320;
  string local_300;
  string local_2e0;
  anon_class_8_1_448b3c02_for_m_fun local_2c0;
  cpp_type_descriptor_f local_2b2;
  allocator<char> local_2b1;
  string local_2b0 [32];
  anon_class_8_1_8991b55a_for_m_fun local_290;
  cpp_type_string_descriptor_f local_281;
  anon_class_8_1_8991b55a_for_m_fun local_280;
  cpp_type_array_descriptor_f local_271;
  anon_class_8_1_8991b55a_for_m_fun local_270;
  cpp_type_string_descriptor_f local_261;
  anon_class_8_1_8991b55a_for_m_fun local_260;
  cpp_type_array_descriptor_f local_251;
  anon_class_8_1_8991b55a_for_m_fun local_250;
  fortran_param_type_from_cpp_f local_242;
  allocator<char> local_241;
  string local_240;
  string local_220;
  string local_200;
  anon_class_8_1_448b3c02_for_m_fun local_1e0;
  ignore_type_f local_1d5 [13];
  string local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream tmp_strm;
  ostream local_198 [376];
  char *local_20;
  char *fortran_name_local;
  char *fortran_cbindings_name_local;
  ostream *strm_local;
  
  local_20 = fortran_name;
  fortran_name_local = fortran_cbindings_name;
  fortran_cbindings_name_local = (char *)strm;
  std::__cxx11::stringstream::stringstream(local_1a8);
  fortran_return_type<int,_0>();
  poVar2 = std::operator<<(local_198,local_1c8);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,local_20);
  std::operator<<(poVar2,"(");
  std::__cxx11::string::~string(local_1c8);
  local_1e0.tmp_strm = (stringstream *)local_1a8;
  for_each_param<int(bindgen_fortran_string_descriptor*),cpp_bindgen::_impl::ignore_type_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(std::__cxx11::string_const&,int)_1_,std::tuple<bindgen_fortran_string_descriptor*>>
            (local_1d5,&local_1e0);
  std::operator<<(local_198,")");
  pcVar1 = fortran_cbindings_name_local;
  std::__cxx11::stringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"    ",&local_241);
  wrap_line(&local_200,&local_220,&local_240);
  std::operator<<((ostream *)pcVar1,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string((string *)&local_220);
  std::operator<<((ostream *)fortran_cbindings_name_local,"      use iso_c_binding\n");
  std::operator<<((ostream *)fortran_cbindings_name_local,"      use bindgen_string_descriptor\n");
  local_250.strm = (ostream *)fortran_cbindings_name_local;
  for_each_param<int(std::__cxx11::string_const&),cpp_bindgen::_impl::fortran_param_type_from_cpp_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(std::__cxx11::string_const&,int)_2_,std::tuple<std::__cxx11::string_const&>>
            (&local_242,&local_250);
  local_260.strm = (ostream *)fortran_cbindings_name_local;
  for_each_param<int(std::__cxx11::string_const&),cpp_bindgen::_impl::cpp_type_array_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(bindgen_fortran_array_descriptor_const*,int)_1_,std::tuple<std::__cxx11::string_const&>>
            (&local_251,&local_260);
  local_270.strm = (ostream *)fortran_cbindings_name_local;
  for_each_param<int(std::__cxx11::string_const&),cpp_bindgen::_impl::cpp_type_string_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(bool,int)_1_,std::tuple<std::__cxx11::string_const&>>
            (&local_261,&local_270);
  std::operator<<((ostream *)fortran_cbindings_name_local,"\n");
  local_280.strm = (ostream *)fortran_cbindings_name_local;
  for_each_param<int(std::__cxx11::string_const&),cpp_bindgen::_impl::cpp_type_array_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(bindgen_fortran_array_descriptor_const*,int)_2_,std::tuple<std::__cxx11::string_const&>>
            (&local_271,&local_280);
  local_290.strm = (ostream *)fortran_cbindings_name_local;
  for_each_param<int(std::__cxx11::string_const&),cpp_bindgen::_impl::cpp_type_string_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(bool,int)_2_,std::tuple<std::__cxx11::string_const&>>
            (&local_281,&local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"",&local_2b1);
  std::__cxx11::stringstream::str((string *)local_1a8);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  poVar2 = std::operator<<(local_198,local_20);
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = std::operator<<(poVar2,fortran_name_local);
  std::operator<<(poVar2,"(");
  local_2c0.tmp_strm = (stringstream *)local_1a8;
  for_each_param<int(std::__cxx11::string_const&),cpp_bindgen::_impl::cpp_type_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(bool,int)_3_,std::tuple<std::__cxx11::string_const&>>
            (&local_2b2,&local_2c0);
  std::operator<<(local_198,")");
  pcVar1 = fortran_cbindings_name_local;
  std::__cxx11::stringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"      ",&local_321);
  wrap_line(&local_2e0,&local_300,&local_320);
  std::operator<<((ostream *)pcVar1,(string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string((string *)&local_300);
  poVar2 = std::operator<<((ostream *)fortran_cbindings_name_local,"    end ");
  fortran_function_specifier<int,_0>();
  std::operator+(&local_348,&local_368,"\n");
  poVar2 = std::operator<<(poVar2,(string *)&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return poVar2;
}

Assistant:

std::ostream &write_fortran_wrapper(
            std::ostream &strm, char const *fortran_cbindings_name, const char *fortran_name) {
            using CSignature = wrapped_t<CppSignature>;

            std::stringstream tmp_strm;
            tmp_strm << fortran_return_type<typename function_traits::result_type<CSignature>::type>() << " "
                     << fortran_name << "(";
            for_each_param<CSignature>(ignore_type_f{}, [&](const std::string &, int i) {
                if (i)
                    tmp_strm << ", ";
                tmp_strm << "arg" << i;
            });
            tmp_strm << ")";
            strm << wrap_line(tmp_strm.str(), "    ");

            strm << "      use iso_c_binding\n";
            if (has_array_descriptor<CSignature>::value)
                strm << "      use bindgen_array_descriptor\n";
            if (has_string_descriptor<CSignature>::value)
                strm << "      use bindgen_string_descriptor\n";
            for_each_param<CppSignature>(fortran_param_type_from_cpp_f{}, [&](const std::string &type_name, int i) {
                strm << "      " << type_name << ", target :: arg" << i << "\n";
            });

            for_each_param<CppSignature>(
                cpp_type_array_descriptor_f{}, [&](bindgen_fortran_array_descriptor const *meta, int i) {
                    if (!meta)
                        return;
                    strm << "      type(bindgen_fortran_array_descriptor) :: descriptor" << i << "\n";
                });
            for_each_param<CppSignature>(cpp_type_string_descriptor_f{}, [&](bool is_descr, int i) {
                if (!is_descr)
                    return;
                strm << "      type(bindgen_fortran_string_descriptor) :: descriptor" << i << "\n";
            });
            strm << "\n";

            for_each_param<CppSignature>(
                cpp_type_array_descriptor_f{}, [&](bindgen_fortran_array_descriptor const *meta, int i) {
                    if (!meta)
                        return;
                    const auto var_name = "arg" + std::to_string(i);
                    const auto desc_name = "descriptor" + std::to_string(i);
                    std::string c_loc = "c_loc(" + var_name + "(";
                    for (int i = 0; i < meta->rank; ++i) {
                        if (i)
                            c_loc += ",";
                        c_loc += "lbound(" + var_name + ", " + std::to_string(i + 1) + ")";
                    }
                    c_loc += "))";
                    if (meta->is_acc_present)
                        strm << "      !$acc data present(" << var_name << ")\n"
                             << "      !$acc host_data use_device(" << var_name << ")\n";
                    strm << "      " << desc_name << "%rank = " << meta->rank << "\n"
                         << "      " << desc_name << "%type = " << meta->type << "\n"
                         << "      " << desc_name << "%dims = reshape(shape(" << var_name << "), &\n"
                         << "        shape(" << desc_name << "%dims), (/0/))\n"
                         << "      " << desc_name << "%data = " << c_loc << "\n";
                    if (meta->is_acc_present)
                        strm << "      !$acc end host_data\n"
                             << "      !$acc end data\n";
                    strm << "\n";
                });

            for_each_param<CppSignature>(cpp_type_string_descriptor_f{}, [&](bool is_descr, int i) {
                if (!is_descr)
                    return;
                strm << "      descriptor" << i << "%data = c_loc(arg" << i << ")\n"
                     << "      descriptor" << i << "%size = len(arg" << i << ")\n\n";
            });

            tmp_strm.str("");
            if (std::is_void<typename function_traits::result_type<CSignature>::type>::value) {
                tmp_strm << "call " << fortran_cbindings_name << "(";
            } else {
                tmp_strm << fortran_name << " = " << fortran_cbindings_name << "(";
            }
            for_each_param<CppSignature>(cpp_type_descriptor_f{}, [&](bool is_descriptor, int i) {
                if (i)
                    tmp_strm << ", ";
                tmp_strm << (is_descriptor ? "descriptor" : "arg") << i;
            });
            tmp_strm << ")";
            strm << wrap_line(tmp_strm.str(), "      ");

            return strm << "    end "
                        << fortran_function_specifier<typename function_traits::result_type<CSignature>::type>() + "\n";
        }